

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_tests.cpp
# Opt level: O0

void __thiscall
rpc_tests::rpc_convert_values_generatetoaddress::test_method
          (rpc_convert_values_generatetoaddress *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  bool bVar1;
  string *psVar2;
  UniValue *this_00;
  long in_FS_OFFSET;
  UniValue result;
  char *in_stack_fffffffffffff098;
  char *in_stack_fffffffffffff0a0;
  char *in_stack_fffffffffffff0a8;
  UniValue *in_stack_fffffffffffff0b0;
  UniValue *in_stack_fffffffffffff0c0;
  lazy_ostream *in_stack_fffffffffffff0c8;
  const_string *in_stack_fffffffffffff0d0;
  const_string *file;
  undefined7 in_stack_fffffffffffff0d8;
  undefined1 in_stack_fffffffffffff0df;
  iterator in_stack_fffffffffffff0e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff0e8;
  UniValue *in_stack_fffffffffffff0f0;
  undefined1 *local_e78;
  undefined1 *local_d60;
  undefined1 *local_c68;
  undefined1 *local_b80;
  UniValue local_ab0;
  undefined1 local_a58 [16];
  undefined1 local_a48 [64];
  UniValue local_a08 [2];
  const_string local_948;
  lazy_ostream local_938 [2];
  assertion_result local_918 [2];
  allocator<char> local_8db;
  allocator<char> local_8da;
  allocator<char> local_8d9 [32];
  allocator<char> local_8b9;
  UniValue local_8b8;
  undefined1 local_860 [16];
  undefined1 local_850 [64];
  UniValue local_810 [2];
  const_string local_750;
  lazy_ostream local_740 [2];
  assertion_result local_720 [2];
  allocator<char> local_6e3;
  allocator<char> local_6e2;
  allocator<char> local_6e1 [32];
  allocator<char> local_6c1;
  undefined1 local_6c0 [16];
  undefined1 local_6b0 [64];
  UniValue local_670 [2];
  const_string local_5b0;
  lazy_ostream local_5a0 [2];
  assertion_result local_580 [2];
  allocator<char> local_542;
  allocator<char> local_541 [32];
  allocator<char> local_521;
  undefined1 local_520 [16];
  undefined1 local_510 [64];
  UniValue local_4d0 [2];
  const_string local_410;
  lazy_ostream local_400 [2];
  assertion_result local_3e0 [2];
  allocator<char> local_3a2;
  allocator<char> local_3a1 [32];
  allocator<char> local_381;
  undefined1 local_380 [96];
  undefined1 local_320 [120];
  undefined1 local_2a8 [96];
  undefined1 local_248 [120];
  undefined1 local_1d0 [64];
  undefined1 local_190 [120];
  undefined1 local_118 [64];
  undefined1 local_d8 [208];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  UniValue::UniValue((UniValue *)in_stack_fffffffffffff098);
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff0e8,(char *)in_stack_fffffffffffff0e0,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff0e8,(char *)in_stack_fffffffffffff0e0,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff0e8,(char *)in_stack_fffffffffffff0e0,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8));
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffff098);
    __l._M_len = (size_type)in_stack_fffffffffffff0e8;
    __l._M_array = in_stack_fffffffffffff0e0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8),__l,
             (allocator_type *)in_stack_fffffffffffff0d0);
    RPCConvertValues(in_stack_fffffffffffff0e0,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8));
    UniValue::operator=((UniValue *)in_stack_fffffffffffff0a8,(UniValue *)in_stack_fffffffffffff0a0)
    ;
    UniValue::~UniValue((UniValue *)in_stack_fffffffffffff098);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff0a8);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffff098);
    local_b80 = local_d8;
    do {
      local_b80 = local_b80 + -0x20;
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff098);
    } while (local_b80 != local_118);
    std::allocator<char>::~allocator(&local_3a2);
    std::allocator<char>::~allocator(local_3a1);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff098);
    std::allocator<char>::~allocator(&local_381);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0,
                 (unsigned_long)in_stack_fffffffffffff098);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff098);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8),
                 in_stack_fffffffffffff0d0,(size_t)in_stack_fffffffffffff0c8,
                 (const_string *)in_stack_fffffffffffff0c0);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffff0a8,
                 SUB81((ulong)in_stack_fffffffffffff0a0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff0a0,(char (*) [118])in_stack_fffffffffffff098
                );
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0,
                 (unsigned_long)in_stack_fffffffffffff098);
      in_stack_fffffffffffff098 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_3e0,local_400,&local_410,0x198,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[118],_const_char_(&)[118]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[118],_const_char_(&)[118]>
                          *)in_stack_fffffffffffff098);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff098);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0,
               (unsigned_long)in_stack_fffffffffffff098);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8),
               in_stack_fffffffffffff0d0,(size_t)in_stack_fffffffffffff0c8,
               (const_string *)in_stack_fffffffffffff0c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff0a0,(char (*) [1])in_stack_fffffffffffff098);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0,
               (unsigned_long)in_stack_fffffffffffff098);
    UniValue::operator[](in_stack_fffffffffffff0b0,(size_t)in_stack_fffffffffffff0a8);
    local_4d0[0]._4_4_ = UniValue::getInt<int>(in_stack_fffffffffffff0f0);
    local_4d0[0].typ = 0x65;
    in_stack_fffffffffffff0a8 = "101";
    in_stack_fffffffffffff0a0 = (char *)local_4d0;
    in_stack_fffffffffffff098 = "result[0].getInt<int>()";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_4d0[0].val.field_2,&local_4d0[0].val,0x199,1,2,&local_4d0[0].field_0x4);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff098);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0,
               (unsigned_long)in_stack_fffffffffffff098);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8),
               in_stack_fffffffffffff0d0,(size_t)in_stack_fffffffffffff0c8,
               (const_string *)in_stack_fffffffffffff0c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff0a0,(char (*) [1])in_stack_fffffffffffff098);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0,
               (unsigned_long)in_stack_fffffffffffff098);
    UniValue::operator[](in_stack_fffffffffffff0b0,(size_t)in_stack_fffffffffffff0a8);
    psVar2 = UniValue::get_str_abi_cxx11_((UniValue *)in_stack_fffffffffffff0a0);
    in_stack_fffffffffffff0a8 = "\"mkESjLZW66TmHhiFX8MCaBjrhZ543PPh9a\"";
    in_stack_fffffffffffff0a0 = "mkESjLZW66TmHhiFX8MCaBjrhZ543PPh9a";
    in_stack_fffffffffffff098 = "result[1].get_str()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[35]>
              (local_510,local_520,0x19a,1,2,psVar2);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff098);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff0e8,(char *)in_stack_fffffffffffff0e0,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff0e8,(char *)in_stack_fffffffffffff0e0,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff0e8,(char *)in_stack_fffffffffffff0e0,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8));
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffff098);
    __l_00._M_len = (size_type)in_stack_fffffffffffff0e8;
    __l_00._M_array = in_stack_fffffffffffff0e0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8),__l_00,
             (allocator_type *)in_stack_fffffffffffff0d0);
    RPCConvertValues(in_stack_fffffffffffff0e0,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8));
    UniValue::operator=((UniValue *)in_stack_fffffffffffff0a8,(UniValue *)in_stack_fffffffffffff0a0)
    ;
    UniValue::~UniValue((UniValue *)in_stack_fffffffffffff098);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff0a8);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffff098);
    local_c68 = local_190;
    do {
      local_c68 = local_c68 + -0x20;
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff098);
    } while (local_c68 != local_1d0);
    std::allocator<char>::~allocator(&local_542);
    std::allocator<char>::~allocator(local_541);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff098);
    std::allocator<char>::~allocator(&local_521);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0,
                 (unsigned_long)in_stack_fffffffffffff098);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff098);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8),
                 in_stack_fffffffffffff0d0,(size_t)in_stack_fffffffffffff0c8,
                 (const_string *)in_stack_fffffffffffff0c0);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffff0a8,
                 SUB81((ulong)in_stack_fffffffffffff0a0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff0a0,(char (*) [118])in_stack_fffffffffffff098
                );
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0,
                 (unsigned_long)in_stack_fffffffffffff098);
      in_stack_fffffffffffff098 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_580,local_5a0,&local_5b0,0x19c,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[118],_const_char_(&)[118]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[118],_const_char_(&)[118]>
                          *)in_stack_fffffffffffff098);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff098);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0,
               (unsigned_long)in_stack_fffffffffffff098);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8),
               in_stack_fffffffffffff0d0,(size_t)in_stack_fffffffffffff0c8,
               (const_string *)in_stack_fffffffffffff0c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff0a0,(char (*) [1])in_stack_fffffffffffff098);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0,
               (unsigned_long)in_stack_fffffffffffff098);
    UniValue::operator[](in_stack_fffffffffffff0b0,(size_t)in_stack_fffffffffffff0a8);
    local_670[0]._4_4_ = UniValue::getInt<int>(in_stack_fffffffffffff0f0);
    local_670[0].typ = 0x65;
    in_stack_fffffffffffff0a8 = "101";
    in_stack_fffffffffffff0a0 = (char *)local_670;
    in_stack_fffffffffffff098 = "result[0].getInt<int>()";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_670[0].val.field_2,&local_670[0].val,0x19d,1,2,&local_670[0].field_0x4);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff098);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0,
               (unsigned_long)in_stack_fffffffffffff098);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8),
               in_stack_fffffffffffff0d0,(size_t)in_stack_fffffffffffff0c8,
               (const_string *)in_stack_fffffffffffff0c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff0a0,(char (*) [1])in_stack_fffffffffffff098);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0,
               (unsigned_long)in_stack_fffffffffffff098);
    UniValue::operator[](in_stack_fffffffffffff0b0,(size_t)in_stack_fffffffffffff0a8);
    psVar2 = UniValue::get_str_abi_cxx11_((UniValue *)in_stack_fffffffffffff0a0);
    in_stack_fffffffffffff0a8 = "\"mhMbmE2tE9xzJYCV9aNC8jKWN31vtGrguU\"";
    in_stack_fffffffffffff0a0 = "mhMbmE2tE9xzJYCV9aNC8jKWN31vtGrguU";
    in_stack_fffffffffffff098 = "result[1].get_str()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[35]>
              (local_6b0,local_6c0,0x19e,1,2,psVar2);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff098);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff0e8,(char *)in_stack_fffffffffffff0e0,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff0e8,(char *)in_stack_fffffffffffff0e0,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff0e8,(char *)in_stack_fffffffffffff0e0,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff0e8,(char *)in_stack_fffffffffffff0e0,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8));
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffff098);
    __l_01._M_len = (size_type)in_stack_fffffffffffff0e8;
    __l_01._M_array = in_stack_fffffffffffff0e0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8),__l_01,
             (allocator_type *)in_stack_fffffffffffff0d0);
    RPCConvertValues(in_stack_fffffffffffff0e0,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8));
    UniValue::operator=((UniValue *)in_stack_fffffffffffff0a8,(UniValue *)in_stack_fffffffffffff0a0)
    ;
    UniValue::~UniValue((UniValue *)in_stack_fffffffffffff098);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff0a8);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffff098);
    local_d60 = local_248;
    do {
      local_d60 = local_d60 + -0x20;
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff098);
    } while (local_d60 != local_2a8);
    std::allocator<char>::~allocator(&local_6e3);
    std::allocator<char>::~allocator(&local_6e2);
    std::allocator<char>::~allocator(local_6e1);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff098);
    std::allocator<char>::~allocator(&local_6c1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0,
                 (unsigned_long)in_stack_fffffffffffff098);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff098);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8),
                 in_stack_fffffffffffff0d0,(size_t)in_stack_fffffffffffff0c8,
                 (const_string *)in_stack_fffffffffffff0c0);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffff0a8,
                 SUB81((ulong)in_stack_fffffffffffff0a0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff0a0,(char (*) [121])in_stack_fffffffffffff098
                );
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0,
                 (unsigned_long)in_stack_fffffffffffff098);
      in_stack_fffffffffffff098 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_720,local_740,&local_750,0x1a0,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[121],_const_char_(&)[121]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[121],_const_char_(&)[121]>
                          *)in_stack_fffffffffffff098);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff098);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0,
               (unsigned_long)in_stack_fffffffffffff098);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8),
               in_stack_fffffffffffff0d0,(size_t)in_stack_fffffffffffff0c8,
               (const_string *)in_stack_fffffffffffff0c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff0a0,(char (*) [1])in_stack_fffffffffffff098);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0,
               (unsigned_long)in_stack_fffffffffffff098);
    UniValue::operator[](in_stack_fffffffffffff0b0,(size_t)in_stack_fffffffffffff0a8);
    local_810[0]._4_4_ = UniValue::getInt<int>(in_stack_fffffffffffff0f0);
    local_810[0].typ = VOBJ;
    in_stack_fffffffffffff0a8 = "1";
    in_stack_fffffffffffff0a0 = (char *)local_810;
    in_stack_fffffffffffff098 = "result[0].getInt<int>()";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_810[0].val.field_2,&local_810[0].val,0x1a1,1,2,&local_810[0].field_0x4);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff098);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0,
               (unsigned_long)in_stack_fffffffffffff098);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8),
               in_stack_fffffffffffff0d0,(size_t)in_stack_fffffffffffff0c8,
               (const_string *)in_stack_fffffffffffff0c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff0a0,(char (*) [1])in_stack_fffffffffffff098);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0,
               (unsigned_long)in_stack_fffffffffffff098);
    UniValue::operator[](in_stack_fffffffffffff0b0,(size_t)in_stack_fffffffffffff0a8);
    psVar2 = UniValue::get_str_abi_cxx11_((UniValue *)in_stack_fffffffffffff0a0);
    in_stack_fffffffffffff0a8 = "\"mkESjLZW66TmHhiFX8MCaBjrhZ543PPh9a\"";
    in_stack_fffffffffffff0a0 = "mkESjLZW66TmHhiFX8MCaBjrhZ543PPh9a";
    in_stack_fffffffffffff098 = "result[1].get_str()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[35]>
              (local_850,local_860,0x1a2,1,2,psVar2);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff098);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0,
               (unsigned_long)in_stack_fffffffffffff098);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8),
               in_stack_fffffffffffff0d0,(size_t)in_stack_fffffffffffff0c8,
               (const_string *)in_stack_fffffffffffff0c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff0a0,(char (*) [1])in_stack_fffffffffffff098);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0,
               (unsigned_long)in_stack_fffffffffffff098);
    UniValue::operator[](in_stack_fffffffffffff0b0,(size_t)in_stack_fffffffffffff0a8);
    local_8b8._4_4_ = UniValue::getInt<int>(in_stack_fffffffffffff0f0);
    local_8b8.typ = 9;
    in_stack_fffffffffffff0a8 = "9";
    in_stack_fffffffffffff0a0 = (char *)&local_8b8;
    in_stack_fffffffffffff098 = "result[2].getInt<int>()";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_8b8.val.field_2,&local_8b8.val,0x1a3,1,2,&local_8b8.field_0x4);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff098);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff0e8,(char *)in_stack_fffffffffffff0e0,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff0e8,(char *)in_stack_fffffffffffff0e0,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff0e8,(char *)in_stack_fffffffffffff0e0,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff0e8,(char *)in_stack_fffffffffffff0e0,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8));
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffff098);
    __l_02._M_len = (size_type)in_stack_fffffffffffff0e8;
    __l_02._M_array = in_stack_fffffffffffff0e0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8),__l_02,
             (allocator_type *)in_stack_fffffffffffff0d0);
    RPCConvertValues(in_stack_fffffffffffff0e0,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8));
    UniValue::operator=((UniValue *)in_stack_fffffffffffff0a8,(UniValue *)in_stack_fffffffffffff0a0)
    ;
    UniValue::~UniValue((UniValue *)in_stack_fffffffffffff098);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff0a8);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffff098);
    local_e78 = local_320;
    do {
      local_e78 = local_e78 + -0x20;
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff098);
    } while (local_e78 != local_380);
    std::allocator<char>::~allocator(&local_8db);
    std::allocator<char>::~allocator(&local_8da);
    std::allocator<char>::~allocator(local_8d9);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff098);
    std::allocator<char>::~allocator(&local_8b9);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0,
                 (unsigned_long)in_stack_fffffffffffff098);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff098);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8),
                 in_stack_fffffffffffff0d0,(size_t)in_stack_fffffffffffff0c8,
                 (const_string *)in_stack_fffffffffffff0c0);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffff0a8,
                 SUB81((ulong)in_stack_fffffffffffff0a0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff0a0,(char (*) [121])in_stack_fffffffffffff098
                );
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0,
                 (unsigned_long)in_stack_fffffffffffff098);
      in_stack_fffffffffffff098 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_918,local_938,&local_948,0x1a5,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[121],_const_char_(&)[121]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[121],_const_char_(&)[121]>
                          *)in_stack_fffffffffffff098);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff098);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0,
               (unsigned_long)in_stack_fffffffffffff098);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8),
               in_stack_fffffffffffff0d0,(size_t)in_stack_fffffffffffff0c8,
               (const_string *)in_stack_fffffffffffff0c0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff0a0,(char (*) [1])in_stack_fffffffffffff098);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0,
               (unsigned_long)in_stack_fffffffffffff098);
    UniValue::operator[](in_stack_fffffffffffff0b0,(size_t)in_stack_fffffffffffff0a8);
    local_a08[0]._4_4_ = UniValue::getInt<int>(in_stack_fffffffffffff0f0);
    local_a08[0].typ = VOBJ;
    in_stack_fffffffffffff0a8 = "1";
    in_stack_fffffffffffff0a0 = (char *)local_a08;
    in_stack_fffffffffffff098 = "result[0].getInt<int>()";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_a08[0].val.field_2,&local_a08[0].val,0x1a6,1,2,&local_a08[0].field_0x4);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff098);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0,
               (unsigned_long)in_stack_fffffffffffff098);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8),
               in_stack_fffffffffffff0d0,(size_t)in_stack_fffffffffffff0c8,
               (const_string *)in_stack_fffffffffffff0c0);
    this_00 = (UniValue *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff0a0,(char (*) [1])in_stack_fffffffffffff098);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0,
               (unsigned_long)in_stack_fffffffffffff098);
    UniValue::operator[](in_stack_fffffffffffff0b0,(size_t)in_stack_fffffffffffff0a8);
    psVar2 = UniValue::get_str_abi_cxx11_((UniValue *)in_stack_fffffffffffff0a0);
    in_stack_fffffffffffff0a8 = "\"mhMbmE2tE9xzJYCV9aNC8jKWN31vtGrguU\"";
    in_stack_fffffffffffff0a0 = "mhMbmE2tE9xzJYCV9aNC8jKWN31vtGrguU";
    in_stack_fffffffffffff098 = "result[1].get_str()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[35]>
              (local_a48,local_a58,0x1a7,1,2,psVar2);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff098);
    in_stack_fffffffffffff0df = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff0df);
  do {
    file = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0,
               (unsigned_long)in_stack_fffffffffffff098);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff098);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8),file
               ,(size_t)in_stack_fffffffffffff0c8,(const_string *)in_stack_fffffffffffff0c0);
    in_stack_fffffffffffff0c8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff0a0,(char (*) [1])in_stack_fffffffffffff098);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8,in_stack_fffffffffffff0a0,
               (unsigned_long)in_stack_fffffffffffff098);
    in_stack_fffffffffffff0c0 =
         UniValue::operator[](in_stack_fffffffffffff0b0,(size_t)in_stack_fffffffffffff0a8);
    local_ab0._4_4_ = UniValue::getInt<int>(this_00);
    local_ab0.typ = 9;
    in_stack_fffffffffffff0a8 = "9";
    in_stack_fffffffffffff0a0 = (char *)&local_ab0;
    in_stack_fffffffffffff098 = "result[2].getInt<int>()";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_ab0.val.field_2,&local_ab0.val,0x1a8,1,2,&local_ab0.field_0x4);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff098);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  UniValue::~UniValue((UniValue *)in_stack_fffffffffffff098);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(rpc_convert_values_generatetoaddress)
{
    UniValue result;

    BOOST_CHECK_NO_THROW(result = RPCConvertValues("generatetoaddress", {"101", "mkESjLZW66TmHhiFX8MCaBjrhZ543PPh9a"}));
    BOOST_CHECK_EQUAL(result[0].getInt<int>(), 101);
    BOOST_CHECK_EQUAL(result[1].get_str(), "mkESjLZW66TmHhiFX8MCaBjrhZ543PPh9a");

    BOOST_CHECK_NO_THROW(result = RPCConvertValues("generatetoaddress", {"101", "mhMbmE2tE9xzJYCV9aNC8jKWN31vtGrguU"}));
    BOOST_CHECK_EQUAL(result[0].getInt<int>(), 101);
    BOOST_CHECK_EQUAL(result[1].get_str(), "mhMbmE2tE9xzJYCV9aNC8jKWN31vtGrguU");

    BOOST_CHECK_NO_THROW(result = RPCConvertValues("generatetoaddress", {"1", "mkESjLZW66TmHhiFX8MCaBjrhZ543PPh9a", "9"}));
    BOOST_CHECK_EQUAL(result[0].getInt<int>(), 1);
    BOOST_CHECK_EQUAL(result[1].get_str(), "mkESjLZW66TmHhiFX8MCaBjrhZ543PPh9a");
    BOOST_CHECK_EQUAL(result[2].getInt<int>(), 9);

    BOOST_CHECK_NO_THROW(result = RPCConvertValues("generatetoaddress", {"1", "mhMbmE2tE9xzJYCV9aNC8jKWN31vtGrguU", "9"}));
    BOOST_CHECK_EQUAL(result[0].getInt<int>(), 1);
    BOOST_CHECK_EQUAL(result[1].get_str(), "mhMbmE2tE9xzJYCV9aNC8jKWN31vtGrguU");
    BOOST_CHECK_EQUAL(result[2].getInt<int>(), 9);
}